

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GeomPrimvar::get_value<std::array<double,4ul>>
          (GeomPrimvar *this,array<double,_4UL> *dest,string *err)

{
  bool bVar1;
  uint32_t tyid;
  value_type *pvVar2;
  PrimVar *this_00;
  TimeSamples *this_01;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_02;
  const_reference pvVar3;
  array<double,_4UL> *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  array<double,_4UL> *pv_1;
  TimeSamples *ts;
  undefined1 local_130 [8];
  string local_128 [32];
  string local_108;
  undefined4 local_e4;
  optional<std::array<double,_4UL>_> local_e0;
  undefined1 local_b8 [8];
  optional<std::array<double,_4UL>_> pv;
  allocator local_69;
  string local_68 [32];
  fmt local_48 [32];
  string *local_28;
  string *err_local;
  array<double,_4UL> *dest_local;
  GeomPrimvar *this_local;
  
  local_28 = err;
  err_local = (string *)dest;
  dest_local = (array<double,_4UL> *)this;
  if (dest == (array<double,_4UL> *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Output value is nullptr.");
    }
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = Attribute::is_blocked(&this->_attr);
    if (bVar1) {
      if (local_28 != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)local_28,"Attribute is blocked.");
      }
      this_local._7_1_ = 0;
    }
    else {
      bVar1 = Attribute::has_value(&this->_attr);
      if (bVar1) {
        tyid = Attribute::type_id(&this->_attr);
        bVar1 = IsSupportedGeomPrimvarType(tyid);
        if (bVar1) {
          Attribute::get_value<std::array<double,4ul>>(&local_e0,&this->_attr);
          nonstd::optional_lite::optional<std::array<double,_4UL>_>::
          optional<std::array<double,_4UL>,_0>
                    ((optional<std::array<double,_4UL>_> *)local_b8,&local_e0);
          nonstd::optional_lite::optional<std::array<double,_4UL>_>::~optional(&local_e0);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b8);
          if (bVar1) {
            pvVar2 = nonstd::optional_lite::optional<std::array<double,_4UL>_>::value
                               ((optional<std::array<double,_4UL>_> *)local_b8);
            *(double *)err_local = pvVar2->_M_elems[0];
            err_local->_M_string_length = (size_type)pvVar2->_M_elems[1];
            (err_local->field_2)._M_allocated_capacity = (size_type)pvVar2->_M_elems[2];
            *(double *)((long)&err_local->field_2 + 8) = pvVar2->_M_elems[3];
            this_local._7_1_ = 1;
          }
          else {
            if (local_28 != (string *)0x0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_128,
                         "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                         ,(allocator *)(local_130 + 7));
              local_130._0_4_ = tinyusdz::value::TypeTraits<std::array<double,_4UL>_>::type_id();
              Attribute::type_name_abi_cxx11_((string *)&ts,&this->_attr);
              fmt::format<unsigned_int,std::__cxx11::string>
                        (&local_108,(fmt *)local_128,(string *)local_130,(uint *)&ts,in_R8);
              ::std::__cxx11::string::operator+=((string *)local_28,(string *)&local_108);
              ::std::__cxx11::string::~string((string *)&local_108);
              ::std::__cxx11::string::~string((string *)&ts);
              ::std::__cxx11::string::~string(local_128);
              ::std::allocator<char>::~allocator((allocator<char> *)(local_130 + 7));
            }
            this_local._7_1_ = 0;
          }
          local_e4 = 1;
          nonstd::optional_lite::optional<std::array<double,_4UL>_>::~optional
                    ((optional<std::array<double,_4UL>_> *)local_b8);
        }
        else {
          if (local_28 != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_68,"Unsupported type for GeomPrimvar. type = `{}`",&local_69);
            Attribute::type_name_abi_cxx11_((string *)((long)&pv.contained + 0x18),&this->_attr);
            fmt::format<std::__cxx11::string>
                      (local_48,(string *)local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&pv.contained + 0x18));
            ::std::__cxx11::string::operator+=((string *)local_28,(string *)local_48);
            ::std::__cxx11::string::~string((string *)local_48);
            ::std::__cxx11::string::~string((string *)((long)&pv.contained + 0x18));
            ::std::__cxx11::string::~string(local_68);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
          }
          this_local._7_1_ = 0;
        }
      }
      else {
        bVar1 = Attribute::has_timesamples(&this->_attr);
        if (bVar1) {
          this_00 = Attribute::get_var(&this->_attr);
          this_01 = primvar::PrimVar::ts_raw(this_00);
          bVar1 = tinyusdz::value::TimeSamples::empty(this_01);
          if (bVar1) {
            if (local_28 != (string *)0x0) {
              ::std::__cxx11::string::operator+=
                        ((string *)local_28,"No TimeSample value in Attribute..");
            }
            this_local._7_1_ = 0;
            goto LAB_0075bdf5;
          }
          this_02 = tinyusdz::value::TimeSamples::get_samples(this_01);
          pvVar3 = ::std::
                   vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ::at((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)this_02,0);
          paVar4 = tinyusdz::value::Value::as<std::array<double,4ul>>(&pvVar3->value,false);
          if (paVar4 != (array<double,_4UL> *)0x0) {
            *(double *)err_local = paVar4->_M_elems[0];
            err_local->_M_string_length = (size_type)paVar4->_M_elems[1];
            (err_local->field_2)._M_allocated_capacity = (size_type)paVar4->_M_elems[2];
            *(double *)((long)&err_local->field_2 + 8) = paVar4->_M_elems[3];
            this_local._7_1_ = 1;
            goto LAB_0075bdf5;
          }
        }
        this_local._7_1_ = 0;
      }
    }
  }
LAB_0075bdf5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}